

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

uint modifier_total_encodings(png_modifier *pm)

{
  uint local_18;
  png_modifier *pm_local;
  
  if ((pm->bit_depth == '\x10') || ((*(uint *)&pm->field_0x63c >> 0x11 & 1) != 0)) {
    local_18 = pm->nencodings;
  }
  else {
    local_18 = 0;
  }
  return pm->ngammas + 1 + pm->nencodings + local_18;
}

Assistant:

static unsigned int
modifier_total_encodings(const png_modifier *pm)
{
   return 1 +                 /* (1) nothing */
      pm->ngammas +           /* (2) gamma values to test */
      pm->nencodings +        /* (3) total number of encodings */
      /* The following test only works after the first time through the
       * png_modifier code because 'bit_depth' is set when the IHDR is read.
       * modifier_reset, below, preserves the setting until after it has called
       * the iterate function (also below.)
       *
       * For this reason do not rely on this function outside a call to
       * modifier_reset.
       */
      ((pm->bit_depth == 16 || pm->assume_16_bit_calculations) ?
         pm->nencodings : 0); /* (4) encodings with gamma == 1.0 */
}